

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration
          (ConversionStream *this,iterator *Token,
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
          *Samplers,ObjectsTypeHashType *Objects,char *SamplerSuffix,Uint32 *ImageBinding)

{
  TokenListType *this_00;
  _List_node_base **pp_Var1;
  int iVar2;
  Uint32 UVar3;
  bool bVar4;
  bool bVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  ostream *poVar8;
  const_iterator cVar9;
  uint uVar10;
  char (*Args_1) [137];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *End;
  __normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>
  __tmp;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  const_iterator cVar11;
  HLSLTokenInfo *Args;
  Uint32 UVar12;
  byte bVar13;
  Uint32 NumComponents;
  ConversionStream *local_2f8;
  _List_node_base *local_2f0;
  HLSLObjectInfo local_2e8;
  _List_node_base *local_2c0;
  Uint32 *local_2b8;
  String *local_2b0;
  ulong local_2a8;
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  *local_2a0;
  String CompleteGLSLSampler;
  HashMapStringKey local_278;
  String ImgFormat;
  String GLSLSampler;
  string err;
  String LayoutQualifier;
  string local_70;
  string local_50;
  
  local_2f0 = Token->_M_node;
  local_2a8 = (ulong)*(uint *)&local_2f0[1]._M_next;
  uVar10 = *(uint *)&local_2f0[1]._M_next - 0x103;
  local_2b0 = (String *)(ulong)uVar10;
  ImgFormat._M_dataplus._M_p = (pointer)&ImgFormat.field_2;
  ImgFormat._M_string_length = 0;
  ImgFormat.field_2._M_local_buf[0] = '\0';
  cVar11._M_node = local_2f0->_M_next;
  Token->_M_node = cVar11._M_node;
  this_00 = &this->m_Tokens;
  Args = (HLSLTokenInfo *)SamplerSuffix;
  local_2f8 = this;
  local_2b8 = ImageBinding;
  local_2a0 = Samplers;
  if (cVar11._M_node == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              (&err,(Diligent *)"Unexpected EOF in ",(char (*) [19])&local_2f0[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
               (char (*) [13])SamplerSuffix);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2e8.GLSLType,local_2f8,Token,4);
    Args = (HLSLTokenInfo *)&err;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x543,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
               (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&err);
    cVar11._M_node = Token->_M_node;
  }
  bVar13 = uVar10 < 8 & 0xf9U >> ((byte)uVar10 & 0x1f);
  GLSLSampler._M_dataplus._M_p = (pointer)&GLSLSampler.field_2;
  GLSLSampler._M_string_length = 0;
  Args_1 = (char (*) [137])0x0;
  GLSLSampler.field_2._M_local_buf[0] = '\0';
  LayoutQualifier._M_dataplus._M_p = (pointer)&LayoutQualifier.field_2;
  LayoutQualifier._M_string_length = 0;
  LayoutQualifier.field_2._M_local_buf[0] = '\0';
  NumComponents = 0;
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &cVar11._M_node[1]._M_prev,"<");
  if (!bVar4) goto LAB_00296f57;
  p_Var6 = Token->_M_node;
  if (*(int *)&p_Var6[1]._M_next != 0x145) {
    FormatString<char[26],char[39]>
              (&err,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ComparisonOp",(char (*) [39])Args_1);
    Args_1 = (char (*) [137])0x54c;
    DebugAssertionFailed
              (err._M_dataplus._M_p,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x54c);
    std::__cxx11::string::~string((string *)&err);
    p_Var6 = Token->_M_node;
  }
  *(undefined4 *)&p_Var6[1]._M_next = 0x139;
  p_Var6 = p_Var6->_M_next;
  Token->_M_node = p_Var6;
  local_2c0 = cVar11._M_node;
  if (p_Var6 == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              (&err,(Diligent *)"Unexpected EOF in ",(char (*) [19])&local_2f0[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
               (char (*) [13])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2e8.GLSLType,local_2f8,Token,4);
    Args = (HLSLTokenInfo *)&err;
    Args_1 = (char (*) [137])0x550;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x550,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
               (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&err);
    p_Var6 = Token->_M_node;
  }
  if (*(int *)&p_Var6[1]._M_next == 299) {
    p_Var6 = p_Var6->_M_next;
    Token->_M_node = p_Var6;
    if (p_Var6 == (_List_node_base *)this_00) {
      FormatString<char[19],std::__cxx11::string,char[13]>
                (&err,(Diligent *)"Unexpected EOF in ",(char (*) [19])&local_2f0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
                 (char (*) [13])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2e8.GLSLType,local_2f8,Token,4);
      Args = (HLSLTokenInfo *)&err;
      Args_1 = (char (*) [137])0x557;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x557,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
                 (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&err);
      p_Var6 = Token->_M_node;
    }
  }
  p_Var7 = p_Var6;
  if (0xbe < *(int *)&p_Var6[1]._M_next - 1U) {
    FormatString<char[42]>(&err,(char (*) [42])"Texture format type must be built-in type");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2e8.GLSLType,local_2f8,Token,4);
    Args = (HLSLTokenInfo *)&err;
    Args_1 = (char (*) [137])0x55d;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x55d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
               (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&err);
    p_Var7 = Token->_M_node;
  }
  uVar10 = *(uint *)&p_Var7[1]._M_next;
  if ((int)uVar10 < 0x16) {
LAB_00296901:
    FormatString<std::__cxx11::string,char[137]>
              (&err,(Diligent *)&p_Var7[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " is not valid texture component type\nOnly the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]"
               ,Args_1);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2e8.GLSLType,local_2f8,Token,4);
    Args = (HLSLTokenInfo *)&err;
    Args_1 = (char (*) [137])0x578;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x578,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
               (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&err);
LAB_00296979:
    if (3 < NumComponents - 1) {
      FormatString<char[38],unsigned_int,char[9]>
                (&err,(Diligent *)"Between 1 and 4 components expected, ",
                 (char (*) [38])&NumComponents,(uint *)" deduced",(char (*) [9])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2e8.GLSLType,local_2f8,Token,4);
      Args = (HLSLTokenInfo *)&err;
      Args_1 = (char (*) [137])0x57a;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x57a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
                 (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&err);
    }
  }
  else {
    if (uVar10 < 0x1b) {
      if (uVar10 != 0x16) {
        NumComponents = uVar10 - 0x16;
        goto LAB_00296979;
      }
      goto LAB_00296896;
    }
    if (uVar10 < 0x2b) goto LAB_00296901;
    if (uVar10 < 0x30) {
      std::__cxx11::string::push_back((char)&GLSLSampler);
      iVar2 = *(int *)&Token->_M_node[1]._M_next;
      if (iVar2 != 0x2b) {
        NumComponents = iVar2 - 0x2b;
        goto LAB_00296979;
      }
    }
    else {
      if (4 < uVar10 - 0x40) goto LAB_00296901;
      std::__cxx11::string::push_back((char)&GLSLSampler);
      iVar2 = *(int *)&Token->_M_node[1]._M_next;
      if (iVar2 != 0x40) {
        NumComponents = iVar2 - 0x40;
        goto LAB_00296979;
      }
    }
LAB_00296896:
    NumComponents = 1;
  }
  p_Var7 = Token->_M_node->_M_next;
  Token->_M_node = p_Var7;
  if (p_Var7 == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              (&err,(Diligent *)"Unexpected EOF in ",(char (*) [19])&local_2f0[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
               (char (*) [13])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2e8.GLSLType,local_2f8,Token,4);
    Args = (HLSLTokenInfo *)&err;
    Args_1 = (char (*) [137])0x57d;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x57d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
               (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&err);
    p_Var7 = Token->_M_node;
  }
  if (((uint)local_2a8 & 0xfffffffe) == 0x120) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &p_Var7[1]._M_prev,",");
    p_Var7 = Token->_M_node;
    if (bVar4) {
      p_Var7 = p_Var7->_M_next;
      Token->_M_node = p_Var7;
      if (p_Var7 == (_List_node_base *)this_00) {
        FormatString<char[19],std::__cxx11::string,char[13]>
                  (&err,(Diligent *)"Unexpected EOF in ",(char (*) [19])&local_2f0[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
                   (char (*) [13])Args);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2e8.GLSLType,local_2f8,Token,4);
        Args = (HLSLTokenInfo *)&err;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x587,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
                   (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&err);
        p_Var7 = Token->_M_node;
      }
      uVar10 = *(int *)&p_Var7[1]._M_next - 0x13b;
      Args_1 = (char (*) [137])(ulong)uVar10;
      if (1 < uVar10) {
        FormatString<char[34],std::__cxx11::string,char[13]>
                  (&err,(Diligent *)"Number of samples is expected in ",
                   (char (*) [34])&local_2f0[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
                   (char (*) [13])Args);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2e8.GLSLType,local_2f8,Token,4);
        Args = (HLSLTokenInfo *)&err;
        Args_1 = (char (*) [137])0x58d;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x58d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
                   (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&err);
        p_Var7 = Token->_M_node;
      }
      p_Var7 = p_Var7->_M_next;
      Token->_M_node = p_Var7;
      if (p_Var7 == (_List_node_base *)this_00) {
        FormatString<char[19],std::__cxx11::string,char[13]>
                  (&err,(Diligent *)"Unexpected EOF in ",(char (*) [19])&local_2f0[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
                   (char (*) [13])Args);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2e8.GLSLType,local_2f8,Token,4);
        Args = (HLSLTokenInfo *)&err;
        Args_1 = (char (*) [137])0x591;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x591,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
                   (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&err);
        p_Var7 = Token->_M_node;
      }
    }
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p_Var7[1]._M_prev,">");
  if (!bVar4) {
    FormatString<char[16],std::__cxx11::string,char[13]>
              (&err,(Diligent *)"Missing \">\" in ",(char (*) [16])&local_2f0[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
               (char (*) [13])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2e8.GLSLType,local_2f8,Token,4);
    Args = (HLSLTokenInfo *)&err;
    Args_1 = (char (*) [137])0x595;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x595,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
               (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&err);
  }
  p_Var7 = Token->_M_node;
  if (*(int *)&p_Var7[1]._M_next != 0x145) {
    FormatString<char[26],char[39]>
              (&err,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ComparisonOp",(char (*) [39])Args_1);
    DebugAssertionFailed
              (err._M_dataplus._M_p,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x597);
    std::__cxx11::string::~string((string *)&err);
    p_Var7 = Token->_M_node;
  }
  *(undefined4 *)&p_Var7[1]._M_next = 0x13a;
  if (bVar13 != 0) {
    local_2e8.GLSLType._M_dataplus._M_p = (pointer)p_Var7[3]._M_prev;
    End = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&((_List_node_base *)local_2e8.GLSLType._M_dataplus._M_p)->_M_next +
             (long)p_Var7[4]._M_next);
    CompleteGLSLSampler._M_dataplus._M_p = (pointer)End;
    Parsing::
    ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&err,(Parsing *)&local_2e8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&CompleteGLSLSampler,End);
    std::__cxx11::string::operator=((string *)&ImgFormat,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    if (ImgFormat._M_string_length == 0) {
      local_2e8.GLSLType._M_dataplus._M_p = (pointer)p_Var6[3]._M_prev;
      CompleteGLSLSampler._M_dataplus._M_p =
           (pointer)((long)&((_List_node_base *)local_2e8.GLSLType._M_dataplus._M_p)->_M_next +
                    (long)p_Var6[4]._M_next);
      Parsing::
      ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&err,(Parsing *)&local_2e8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&CompleteGLSLSampler,End);
      std::__cxx11::string::operator=((string *)&ImgFormat,(string *)&err);
      std::__cxx11::string::~string((string *)&err);
      if (ImgFormat._M_string_length == 0) goto LAB_00296ec0;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&err);
    poVar8 = std::operator<<((ostream *)err.field_2._M_local_buf,"layout(");
    poVar8 = std::operator<<(poVar8,(string *)&ImgFormat);
    poVar8 = std::operator<<(poVar8,", binding=");
    *local_2b8 = *local_2b8 + 1;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,")");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&LayoutQualifier,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&err);
  }
LAB_00296ec0:
  cVar11._M_node = local_2c0;
  p_Var6 = Token->_M_node->_M_next;
  Token->_M_node = p_Var6;
  if (p_Var6 == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              (&err,(Diligent *)"Unexpected EOF in ",(char (*) [19])&local_2f0[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
               (char (*) [13])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2e8.GLSLType,local_2f8,Token,4);
    Args = (HLSLTokenInfo *)&err;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x5b2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
               (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&err);
  }
LAB_00296f57:
  std::__cxx11::string::append((char *)&GLSLSampler);
  if ((uint)local_2b0 < 0x22) {
    (*(code *)(&DAT_005de684 + *(int *)(&DAT_005de684 + (long)local_2b0 * 4)))();
    return;
  }
  if ((int)local_2a8 == 0xcf) {
    std::__cxx11::string::append((char *)&GLSLSampler);
  }
  else {
    FormatString<char[24]>(&err,(char (*) [24])"Unexpected texture type");
    DebugAssertionFailed
              (err._M_dataplus._M_p,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x5d4);
    std::__cxx11::string::~string((string *)&err);
  }
  local_2c0 = (_List_node_base *)CONCAT71(local_2c0._1_7_,bVar13);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::erase
            (this_00,cVar11,Token->_M_node);
  local_2b8 = (Uint32 *)
              ((long)(local_2a0->
                     super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_2a0->
                    super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  p_Var6 = Token->_M_node;
  do {
    if (*(int *)&p_Var6[1]._M_next != 0x13b) {
      FormatString<char[24],std::__cxx11::string,char[13]>
                (&err,(Diligent *)"Identifier expected in ",(char (*) [24])&local_2f0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e05a4,
                 (char (*) [13])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2e8.GLSLType,local_2f8,Token,4);
      Args = (HLSLTokenInfo *)&err;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x5e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&err);
      p_Var6 = Token->_M_node;
    }
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &p_Var6[3]._M_prev,"");
    if (bVar4) {
      std::__cxx11::string::assign((char *)&Token->_M_node[3]._M_prev);
    }
    CompleteGLSLSampler._M_dataplus._M_p = (pointer)Token->_M_node;
    local_2b0 = (String *)
                &((_List_node_base *)((long)CompleteGLSLSampler._M_dataplus._M_p + 0x10))->_M_prev;
    UVar12 = 0;
    while ((CompleteGLSLSampler._M_dataplus._M_p =
                 (pointer)((_List_node_base *)CompleteGLSLSampler._M_dataplus._M_p)->_M_next,
           (TokenListType *)CompleteGLSLSampler._M_dataplus._M_p != this_00 &&
           (*(int *)&((_List_node_base *)((long)CompleteGLSLSampler._M_dataplus._M_p + 0x10))->
                     _M_next == 0x137))) {
      err._M_dataplus._M_p =
           (pointer)(this_00->
                    super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                    )._M_impl._M_node.super__List_node_base._M_next;
      local_2e8.GLSLType._M_dataplus._M_p = (pointer)this_00;
      CompleteGLSLSampler._M_dataplus._M_p =
           (pointer)Parsing::
                    FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                              ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&err,
                               (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_2e8,
                               (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)
                               CompleteGLSLSampler._M_dataplus._M_p);
      if ((TokenListType *)CompleteGLSLSampler._M_dataplus._M_p == this_00) {
        FormatString<char[48]>
                  (&err,(char (*) [48])"Unable to find matching closing square bracket.");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2e8.GLSLType,local_2f8,
                   (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&CompleteGLSLSampler,4);
        Args = (HLSLTokenInfo *)&err;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x5ff,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   (char (*) [2])0x5ddb85,&local_2e8.GLSLType);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&err);
      }
      UVar12 = UVar12 + 1;
    }
    std::__cxx11::string::string((string *)&CompleteGLSLSampler,(string *)&GLSLSampler);
    if ((char)local_2c0 == '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                     local_2b0,SamplerSuffix);
      this_01 = &((local_2a0->
                  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish)->_M_h;
      do {
        if (this_01 ==
            &((local_2a0->
              super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->_M_h) goto LAB_00297250;
        this_01 = this_01 + -1;
        cVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(this_01,(key_type *)&err);
      } while (cVar9.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
               ._M_cur == (__node_type *)0x0);
      if (*(char *)((long)cVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                          ._M_cur + 0x28) == '\x01') {
        std::__cxx11::string::append((char *)&CompleteGLSLSampler);
      }
LAB_00297250:
      std::__cxx11::string::~string((string *)&err);
    }
    pp_Var1 = &local_2f0[1]._M_prev;
    std::__cxx11::string::assign((char *)pp_Var1);
    if (local_2b8 == (Uint32 *)0x38) {
      std::__cxx11::string::append((string *)pp_Var1);
      std::__cxx11::string::append((char *)pp_Var1);
      if (((((char)local_2c0 != '\0') && (bVar4 = std::operator!=(&ImgFormat,"r32f"), bVar4)) &&
          (bVar4 = std::operator!=(&ImgFormat,"r32i"), bVar4)) &&
         (bVar4 = std::operator!=(&ImgFormat,"r32ui"), bVar4)) {
        std::__cxx11::string::append((char *)pp_Var1);
      }
    }
    std::__cxx11::string::append((string *)pp_Var1);
    HashMapStringKey::HashMapStringKey(&local_278,local_2b0,true);
    UVar3 = NumComponents;
    std::__cxx11::string::string((string *)&local_2e8,(string *)&CompleteGLSLSampler);
    local_2e8.NumComponents = UVar3;
    local_2e8.ArrayDim = UVar12;
    std::pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>::
    pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo,_true>
              ((pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo> *
               )&err,&local_278,&local_2e8);
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::HashMapStringKey,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>
              ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)Objects,(HLSLTokenInfo *)&err);
    std::pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>::~pair
              ((pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo> *
               )&err);
    std::__cxx11::string::~string((string *)&local_2e8);
    HashMapStringKey::Clear(&local_278);
    bVar4 = true;
    if (local_2b8 == (Uint32 *)0x38) {
      cVar11._M_node = Token->_M_node;
      while (cVar11._M_node != (_List_node_base *)this_00) {
        if ((*(uint *)&cVar11._M_node[1]._M_next & 0xfffffffe) == 0x13e) {
          if (*(uint *)&cVar11._M_node[1]._M_next != 0x13f) {
            Token->_M_node = (cVar11._M_node)->_M_next;
            goto LAB_002974a1;
          }
          *(undefined4 *)&cVar11._M_node[1]._M_next = 0x13e;
          std::__cxx11::string::assign((char *)&cVar11._M_node[1]._M_prev);
          cVar11._M_node = Token->_M_node->_M_next;
          Token->_M_node = cVar11._M_node;
          std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_2e8);
          std::__cxx11::string::string((string *)&local_70,"\n",(allocator *)&local_278);
          Args = (HLSLTokenInfo *)0xffffffffffffffff;
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,(TokenType)local_2a8,&local_50,&local_70,
                     0xffffffffffffffff);
          local_2f0 = (_List_node_base *)
                      std::__cxx11::
                      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                      ::emplace<Diligent::Parsing::HLSLTokenInfo>
                                (this_00,cVar11,(HLSLTokenInfo *)&err);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          break;
        }
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cVar11._M_node[1]._M_prev,":");
        if (bVar5) {
          while ((cVar11._M_node = Token->_M_node, cVar11._M_node != (_List_node_base *)this_00 &&
                 (((ulong)cVar11._M_node[1]._M_next & 0xfffffffe) != 0x13e))) {
            Token->_M_node = (cVar11._M_node)->_M_next;
            std::__cxx11::
            list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            ::erase(this_00,cVar11);
          }
        }
        else {
          cVar11._M_node = Token->_M_node->_M_next;
          Token->_M_node = cVar11._M_node;
        }
      }
      bVar4 = false;
    }
LAB_002974a1:
    std::__cxx11::string::~string((string *)&CompleteGLSLSampler);
    if ((bVar4) || (p_Var6 = Token->_M_node, p_Var6 == (_List_node_base *)this_00)) {
      std::__cxx11::string::~string((string *)&LayoutQualifier);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&ImgFormat);
      return;
    }
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration(TokenListType::iterator&            Token,
                                                                         const std::vector<SamplerHashType>& Samplers,
                                                                         ObjectsTypeHashType&                Objects,
                                                                         const char*                         SamplerSuffix,
                                                                         Uint32&                             ImageBinding)
{
    auto TexDeclToken = Token;
    auto TextureDim   = TexDeclToken->Type;
    // Texture2D < float > ... ;
    // ^
    bool IsRWTexture =
        TextureDim == TokenType::kw_RWTexture1D ||
        TextureDim == TokenType::kw_RWTexture1DArray ||
        TextureDim == TokenType::kw_RWTexture2D ||
        TextureDim == TokenType::kw_RWTexture2DArray ||
        TextureDim == TokenType::kw_RWTexture3D ||
        TextureDim == TokenType::kw_RWBuffer;
    String ImgFormat;

    ++Token;
    // Texture2D < float > ... ;
    //           ^
#define CHECK_EOF() VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", TexDeclToken->Literal, " declaration")
    CHECK_EOF();

    auto   TypeDefinitionStart = Token;
    String GLSLSampler;
    String LayoutQualifier;
    Uint32 NumComponents = 0;
    if (Token->Literal == "<")
    {
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::OpenAngleBracket;

        ++Token;
        CHECK_EOF();

        if (Token->Type == TokenType::kw_unorm)
        {
            // RWTexture2D < unorm float4 > ... ;
            //               ^
            ++Token;
            CHECK_EOF();
        }

        // Texture2D < float > ... ;
        //             ^
        auto TexFmtToken = Token;
        VERIFY_PARSER_STATE(Token, Token->IsBuiltInType(), "Texture format type must be built-in type");
        if (Token->Type >= TokenType::kw_float && Token->Type <= TokenType::kw_float4)
        {
            if (Token->Type == TokenType::kw_float)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_float);
        }
        else if (Token->Type >= TokenType::kw_int && Token->Type <= TokenType::kw_int4)
        {
            GLSLSampler.push_back('i');
            if (Token->Type == TokenType::kw_int)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_int);
        }
        else if (Token->Type >= TokenType::kw_uint && Token->Type <= TokenType::kw_uint4)
        {
            GLSLSampler.push_back('u');
            if (Token->Type == TokenType::kw_uint)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_uint);
        }
        else
        {
            VERIFY_PARSER_STATE(Token, false, Token->Literal, " is not valid texture component type\n"
                                                              "Only the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]");
        }
        VERIFY_PARSER_STATE(Token, NumComponents >= 1 && NumComponents <= 4, "Between 1 and 4 components expected, ", NumComponents, " deduced");

        ++Token;
        CHECK_EOF();
        // Texture2D < float > ... ;
        //                   ^
        if ((TextureDim == TokenType::kw_Texture2DMS ||
             TextureDim == TokenType::kw_Texture2DMSArray) &&
            Token->Literal == ",")
        {
            // Texture2DMS < float, 4 > ... ;
            //                    ^
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                      ^
            // Texture2DMS < float, SAMPLE_COUNT > ... ;
            //                      ^
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier,
                                "Number of samples is expected in ", TexDeclToken->Literal, " declaration");

            // We do not really need the number of samples, so just skip it
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                        ^
        }
        VERIFY_PARSER_STATE(Token, Token->Literal == ">", "Missing \">\" in ", TexDeclToken->Literal, " declaration");
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::ClosingAngleBracket;

        if (IsRWTexture)
        {
            // RWTexture2D<float /* format = r32f */ >
            //                                       ^
            ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(Token->Delimiter.begin(), Token->Delimiter.end());
            if (ImgFormat.length() == 0)
            {
                // RWTexture2D</* format = r32f */ float >
                //                                 ^
                //                            TexFmtToken
                ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(TexFmtToken->Delimiter.begin(), TexFmtToken->Delimiter.end());
            }

            if (ImgFormat.length() != 0)
            {
                std::stringstream ss;
                ss << "layout(" << ImgFormat << ", binding=" << ImageBinding++ << ")";
                LayoutQualifier = ss.str();
            }
        }

        ++Token;
        // Texture2D < float > TexName ;
        //                     ^
        CHECK_EOF();
    }

    if (IsRWTexture)
        GLSLSampler.append("image");
    else
        GLSLSampler.append("sampler");

    switch (TextureDim)
    {
        // clang-format off
        case TokenType::kw_RWTexture1D:
        case TokenType::kw_Texture1D:          GLSLSampler += "1D";        break;

        case TokenType::kw_RWTexture1DArray:
        case TokenType::kw_Texture1DArray:     GLSLSampler += "1DArray";   break;

        case TokenType::kw_RWTexture2D:
        case TokenType::kw_Texture2D:          GLSLSampler += "2D";        break;

        case TokenType::kw_RWTexture2DArray:
        case TokenType::kw_Texture2DArray:     GLSLSampler += "2DArray";   break;

        case TokenType::kw_RWTexture3D:
        case TokenType::kw_Texture3D:          GLSLSampler += "3D";        break;

        case TokenType::kw_TextureCube:        GLSLSampler += "Cube";      break;
        case TokenType::kw_TextureCubeArray:   GLSLSampler += "CubeArray"; break;
        case TokenType::kw_Texture2DMS:        GLSLSampler += "2DMS";      break;
        case TokenType::kw_Texture2DMSArray:   GLSLSampler += "2DMSArray"; break;

        case TokenType::kw_RWBuffer:
        case TokenType::kw_Buffer:             GLSLSampler += "Buffer";    break;
        // clang-format on
        default: UNEXPECTED("Unexpected texture type");
    }

    //   TypeDefinitionStart
    //           |
    // Texture2D < float > TexName ;
    //                     ^
    m_Tokens.erase(TypeDefinitionStart, Token);
    // Texture2D TexName ;
    //           ^

    bool IsGlobalScope = Samplers.size() == 1;

    // There may be more than one texture variable declared in the same
    // statement:
    // Texture2D<float> g_Tex2D1, g_Tex2D1;
    do
    {
        // Texture2D TexName ;
        //           ^
        VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected in ", TexDeclToken->Literal, " declaration");

        // Make sure there is a delimiter between sampler keyword and the
        // identifier. In cases like this
        // Texture2D<float>Name;
        // There will be no whitespace
        if (Token->Delimiter == "")
            Token->Delimiter = " ";

        // Texture2D TexName ;
        //           ^
        const auto& TextureName = Token->Literal;

        // Determine resource array dimensionality
        Uint32 ArrayDim = 0;
        {
            auto TmpToken = Token;
            ++TmpToken;
            while (TmpToken != m_Tokens.end() && TmpToken->Type == TokenType::OpenSquareBracket)
            {
                // Texture2D TexName[...][...]
                //                  ^
                TmpToken = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), TmpToken);
                VERIFY_PARSER_STATE(TmpToken, TmpToken != m_Tokens.end(), "Unable to find matching closing square bracket.");

                // Texture2D TexName[...][...]
                //                      ^

                ++ArrayDim;

                ++TmpToken;
                // Texture2D TexName[...][...]
                //                       ^
            }
        }

        auto CompleteGLSLSampler = GLSLSampler;
        if (!IsRWTexture)
        {
            // Try to find matching sampler
            auto SamplerName = TextureName + SamplerSuffix;
            // Search all scopes starting with the innermost
            for (auto ScopeIt = Samplers.rbegin(); ScopeIt != Samplers.rend(); ++ScopeIt)
            {
                auto SamplerIt = ScopeIt->find(SamplerName);
                if (SamplerIt != ScopeIt->end())
                {
                    if (SamplerIt->second)
                        CompleteGLSLSampler.append("Shadow");
                    break;
                }
            }
        }

        // TexDeclToken
        // |
        // Texture2D TexName ;
        //           ^
        TexDeclToken->Literal = "";
        if (IsGlobalScope)
        {
            // Use layout qualifier for global variables only, not for function arguments
            TexDeclToken->Literal.append(LayoutQualifier);
            // Samplers and images in global scope must be declared uniform.
            // Function arguments must not be declared uniform
            TexDeclToken->Literal.append("uniform ");
            // From GLES 3.1 spec:
            //    Except for image variables qualified with the format qualifiers r32f, r32i, and r32ui,
            //    image variables must specify either memory qualifier readonly or the memory qualifier writeonly.
            // So on GLES we have to assume that an image is a writeonly variable
            if (IsRWTexture && ImgFormat != "r32f" && ImgFormat != "r32i" && ImgFormat != "r32ui")
                TexDeclToken->Literal.append("IMAGE_WRITEONLY "); // defined as 'writeonly' on GLES and as '' on desktop in GLSLDefinitions.h
        }
        TexDeclToken->Literal.append(CompleteGLSLSampler);
        Objects.m.insert(std::make_pair(HashMapStringKey(TextureName), HLSLObjectInfo{std::move(CompleteGLSLSampler), NumComponents, ArrayDim}));

        // In global scope, multiple variables can be declared in the same statement
        if (IsGlobalScope)
        {
            // Texture2D TexName, TexName2 ;
            //           ^

            // Go to the next texture in the declaration or to the statement end, removing register declarations
            while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
            {
                if (Token->Literal == ":")
                {
                    // Texture2D TexName : register(t0);
                    // Texture2D TexName : register(t0),
                    //                   ^

                    // Remove register
                    while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    {
                        auto CurrToken = Token;
                        ++Token;
                        m_Tokens.erase(CurrToken);
                    }

                    // Texture2D TexName ,
                    //                   ^
                }
                else
                {
                    ++Token;
                }
            }

            if (Token != m_Tokens.end())
            {
                if (Token->Type == TokenType::Comma)
                {
                    // Texture2D TexName, TexName2 ;
                    //                  ^
                    Token->Type    = TokenType::Semicolon;
                    Token->Literal = ";";
                    // Texture2D TexName; TexName2 ;
                    //                  ^

                    ++Token;
                    // Texture2D TexName; TexName2 ;
                    //                    ^

                    // Insert empty token that will contain next sampler/image declaration
                    TexDeclToken = m_Tokens.insert(Token, TokenInfo(TextureDim, "", "\n"));
                    // Texture2D TexName;
                    // <Texture Declaration TBD> TexName2 ;
                    // ^                         ^
                    // TexDeclToken              Token
                }
                else
                {
                    // Texture2D TexName, TexName2 ;
                    //                             ^
                    ++Token;
                    break;
                }
            }
        }
    } while (IsGlobalScope && Token != m_Tokens.end());

#undef SKIP_DELIMITER
#undef CHECK_EOF
}